

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_value_numbering.cpp
# Opt level: O3

bool __thiscall mocker::GlobalValueNumbering::operator()(GlobalValueNumbering *this)

{
  _List_node_base *p_Var1;
  size_t sVar2;
  __alloc_node_gen_t __alloc_node_gen;
  ExprRegMap exprReg;
  ValueNumberTable valueNumber;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Addr>_>,_true>_>_>
  local_100;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_f8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_c0;
  _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Addr>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_88;
  _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Addr>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_50;
  
  DominatorTree::init(&this->dominatorTree,(EVP_PKEY_CTX *)(this->super_FuncPass).func);
  local_50._M_buckets = &local_50._M_single_bucket;
  local_50._M_bucket_count = 1;
  local_50._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_50._M_element_count = 0;
  local_50._M_rehash_policy._M_max_load_factor = 1.0;
  local_50._M_rehash_policy._M_next_resize._0_4_ = 0;
  local_50._M_rehash_policy._M_next_resize._4_4_ = 0;
  local_50._M_single_bucket = (__node_base_ptr)0x0;
  local_f8._M_buckets = &local_f8._M_single_bucket;
  local_f8._M_bucket_count = 1;
  local_f8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_f8._M_element_count = 0;
  local_f8._M_rehash_policy._M_max_load_factor = 1.0;
  local_f8._M_rehash_policy._M_next_resize = 0;
  local_f8._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = (((this->super_FuncPass).func)->bbs).
           super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl
           ._M_node.super__List_node_base._M_next[1]._M_next;
  local_100._M_h = (__hashtable_alloc *)&local_88;
  local_88._M_buckets = (__buckets_ptr)0x0;
  local_88._M_bucket_count = 1;
  local_88._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_88._M_element_count = 0;
  local_88._M_rehash_policy._M_max_load_factor = 1.0;
  local_88._M_rehash_policy._4_8_ = ZEXT48((uint)local_50._M_rehash_policy._4_4_);
  local_88._M_rehash_policy._M_next_resize._4_4_ = 0;
  local_88._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::shared_ptr<mocker::ir::Reg>,std::pair<std::shared_ptr<mocker::ir::Reg>const,std::shared_ptr<mocker::ir::Addr>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Reg>const,std::shared_ptr<mocker::ir::Addr>>>,std::__detail::_Select1st,mocker::ir::RegPtrEqual,mocker::ir::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::shared_ptr<mocker::ir::Reg>,std::pair<std::shared_ptr<mocker::ir::Reg>const,std::shared_ptr<mocker::ir::Addr>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Reg>const,std::shared_ptr<mocker::ir::Addr>>>,std::__detail::_Select1st,mocker::ir::RegPtrEqual,mocker::ir::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::shared_ptr<mocker::ir::Reg>const,std::shared_ptr<mocker::ir::Addr>>,true>>>>
            ((_Hashtable<std::shared_ptr<mocker::ir::Reg>,std::pair<std::shared_ptr<mocker::ir::Reg>const,std::shared_ptr<mocker::ir::Addr>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Reg>const,std::shared_ptr<mocker::ir::Addr>>>,std::__detail::_Select1st,mocker::ir::RegPtrEqual,mocker::ir::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_100._M_h,&local_50,&local_100);
  local_100._M_h = (__hashtable_alloc *)&local_c0;
  local_c0._M_buckets = (__buckets_ptr)0x0;
  local_c0._M_bucket_count = local_f8._M_bucket_count;
  local_c0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_c0._M_element_count = local_f8._M_element_count;
  local_c0._M_rehash_policy._4_4_ = local_f8._M_rehash_policy._4_4_;
  local_c0._M_rehash_policy._M_max_load_factor = local_f8._M_rehash_policy._M_max_load_factor;
  local_c0._M_rehash_policy._M_next_resize = local_f8._M_rehash_policy._M_next_resize;
  local_c0._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<mocker::ir::Reg>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<mocker::ir::Reg>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<mocker::ir::Reg>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<mocker::ir::Reg>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::shared_ptr<mocker::ir::Reg>>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<mocker::ir::Reg>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<mocker::ir::Reg>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_100._M_h,&local_f8,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_true>_>_>
              *)&local_100);
  doValueNumbering(this,p_Var1,&local_88,&local_c0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_c0);
  std::
  _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Addr>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_88);
  removeDeletedInsts((this->super_FuncPass).func);
  sVar2 = this->cnt;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_f8);
  std::
  _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Addr>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_50);
  return sVar2 != 0;
}

Assistant:

bool GlobalValueNumbering::operator()() {
  dominatorTree.init(func);
  detail::ValueNumberTable valueNumber;
  detail::InstHash instHash;
  ExprRegMap exprReg;
  doValueNumbering(func.getFirstBBLabel(), valueNumber, instHash, exprReg);
  removeDeletedInsts(func);
  return cnt != 0;
}